

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_memory.c
# Opt level: O0

ssize_t memory_write(archive *a,void *client_data,void *buff,size_t length)

{
  write_memory_data *mine;
  size_t length_local;
  void *buff_local;
  void *client_data_local;
  archive *a_local;
  
  if (*(ulong *)((long)client_data + 8) < *client_data + length) {
    archive_set_error(a,0xc,"Buffer exhausted");
    a_local = (archive *)0xffffffffffffffe2;
  }
  else {
    memcpy((void *)(*(long *)((long)client_data + 0x18) + *client_data),buff,length);
    *(size_t *)client_data = length + *client_data;
    a_local = (archive *)length;
    if (*(long *)((long)client_data + 0x10) != 0) {
      **(undefined8 **)((long)client_data + 0x10) = *client_data;
    }
  }
  return (ssize_t)a_local;
}

Assistant:

static ssize_t
memory_write(struct archive *a, void *client_data, const void *buff, size_t length)
{
	struct write_memory_data *mine;
	mine = client_data;

	if (mine->used + length > mine->size) {
		archive_set_error(a, ENOMEM, "Buffer exhausted");
		return (ARCHIVE_FATAL);
	}
	memcpy(mine->buff + mine->used, buff, length);
	mine->used += length;
	if (mine->client_size != NULL)
		*mine->client_size = mine->used;
	return (length);
}